

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::addCopyTests
               (TestCaseGroup *root,deUint32 srcFormat,deUint32 dstFormat)

{
  uint uVar1;
  Context *pCVar2;
  TestCaseGroup *pTVar3;
  bool bVar4;
  CompressedTexFormat CVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  TestNode *pTVar9;
  ulong *puVar10;
  size_type *psVar11;
  deUint32 internalFormat;
  uint *puVar12;
  undefined4 in_register_00000034;
  char *__s;
  ulong uVar13;
  undefined8 uVar14;
  long lVar15;
  string targetTestName;
  string groupName;
  IVec3 dstSize;
  IVec3 srcSize;
  allocator<char> local_109;
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  deUint32 local_e4;
  string local_e0;
  string local_c0;
  long local_a0;
  ulong local_98;
  long *local_90;
  undefined8 local_88;
  long local_80;
  undefined8 uStack_78;
  TestCaseGroup *local_70;
  ulong local_68;
  ulong local_60;
  TestNode *local_58;
  TestContext *local_50;
  undefined8 local_48;
  undefined4 local_40;
  pointer local_3c;
  undefined4 local_34;
  
  local_70 = root;
  Functional::(anonymous_namespace)::formatToName_abi_cxx11_
            (&local_e0,(_anonymous_namespace_ *)CONCAT44(in_register_00000034,srcFormat),dstFormat);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_108 = &local_f8;
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_f8 = *puVar10;
    lStack_f0 = plVar7[3];
  }
  else {
    local_f8 = *puVar10;
    local_108 = (ulong *)*plVar7;
  }
  local_100 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  Functional::(anonymous_namespace)::formatToName_abi_cxx11_
            (&local_c0,(_anonymous_namespace_ *)(ulong)dstFormat,(deUint32)local_100);
  uVar13 = 0xf;
  if (local_108 != &local_f8) {
    uVar13 = local_f8;
  }
  if (uVar13 < local_c0._M_string_length + local_100) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      uVar14 = local_c0.field_2._M_allocated_capacity;
    }
    if (local_c0._M_string_length + local_100 <= (ulong)uVar14) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_108);
      goto LAB_016609e7;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_c0._M_dataplus._M_p);
LAB_016609e7:
  local_90 = &local_80;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_80 = *plVar7;
    uStack_78 = puVar8[3];
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*puVar8;
  }
  local_88 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_e4 = dstFormat;
  pTVar9 = (TestNode *)operator_new(0x78);
  pTVar3 = local_70;
  pCVar2 = local_70->m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,pCVar2->m_testCtx,(char *)local_90,(char *)local_90);
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar2;
  local_58 = pTVar9;
  tcu::TestNode::addChild((TestNode *)pTVar3,pTVar9);
  local_60 = (ulong)local_e4;
  local_68 = (ulong)srcFormat;
  lVar15 = 0;
  internalFormat = local_e4;
  do {
    uVar1 = (&DAT_01c92540)[lVar15];
    local_a0 = lVar15;
    bVar4 = glu::isCompressedFormat(srcFormat);
    if ((local_a0 == 4 && bVar4) ||
       ((local_a0 == 4 && (bVar4 = isColorRenderable(srcFormat), !bVar4)))) break;
    bVar4 = glu::isCompressedFormat(srcFormat);
    local_98 = (ulong)uVar1;
    if (bVar4) {
      CVar5 = glu::mapGLCompressedTexFormat(srcFormat);
      bVar4 = tcu::isAstcFormat(CVar5);
      if (((uint)local_a0 & 5) != 1 || bVar4) goto LAB_01660b7e;
    }
    else {
LAB_01660b7e:
      local_50 = (TestContext *)((local_98 << 0x20) + local_68);
      puVar12 = &DAT_01c92540;
      lVar15 = 0;
      do {
        uVar1 = *puVar12;
        bVar4 = glu::isCompressedFormat(internalFormat);
        if ((lVar15 == 4 && bVar4) ||
           ((lVar15 == 4 && (bVar4 = isColorRenderable(internalFormat), !bVar4)))) break;
        bVar4 = glu::isCompressedFormat(internalFormat);
        if (bVar4) {
          CVar5 = glu::mapGLCompressedTexFormat(internalFormat);
          bVar4 = tcu::isAstcFormat(CVar5);
          if (((uint)lVar15 & 5) != 1 || bVar4) goto LAB_01660c02;
        }
        else {
LAB_01660c02:
          iVar6 = (int)local_98;
          if (iVar6 < 0x8513) {
            if (iVar6 == 0xde1) {
              __s = "texture2d";
            }
            else if (iVar6 == 0x806f) {
              __s = "texture3d";
            }
            else {
LAB_01660c61:
              __s = (char *)0x0;
            }
          }
          else if (iVar6 == 0x8513) {
            __s = "cubemap";
          }
          else if (iVar6 == 0x8c1a) {
            __s = "texture2d_array";
          }
          else {
            __s = "renderbuffer";
            if (iVar6 != 0x8d41) goto LAB_01660c61;
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,__s,&local_109);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_c0);
          psVar11 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_e0.field_2._M_allocated_capacity = *psVar11;
            local_e0.field_2._8_8_ = plVar7[3];
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          }
          else {
            local_e0.field_2._M_allocated_capacity = *psVar11;
            local_e0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_e0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
          local_108 = &local_f8;
          puVar10 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar10) {
            local_f8 = *puVar10;
            lStack_f0 = plVar7[3];
          }
          else {
            local_f8 = *puVar10;
            local_108 = (ulong *)*plVar7;
          }
          local_100 = plVar7[1];
          *plVar7 = (long)puVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          pTVar3 = local_70;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          bVar4 = glu::isCompressedFormat(srcFormat);
          if (bVar4) {
            iVar6 = 0x10;
            local_e0._M_dataplus._M_p._4_4_ = 0x80;
          }
          else {
            bVar4 = glu::isCompressedFormat(internalFormat);
            iVar6 = (uint)bVar4 * 8 + 8;
            local_e0._M_dataplus._M_p._4_4_ = (uint)bVar4 * 0x40 + 0x40;
          }
          local_e0._M_dataplus._M_p._0_4_ = local_e0._M_dataplus._M_p._4_4_;
          local_e0._M_string_length = CONCAT44(local_e0._M_string_length._4_4_,iVar6);
          getTestedSize((anon_unknown_0 *)&local_3c,(deUint32)local_98,srcFormat,(IVec3 *)&local_e0)
          ;
          getTestedSize((anon_unknown_0 *)&local_48,uVar1,internalFormat,(IVec3 *)&local_e0);
          pTVar9 = (TestNode *)operator_new(0xb0);
          pCVar2 = pTVar3->m_context;
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar9,pCVar2->m_testCtx,(char *)local_108,(char *)local_108);
          pTVar9[1]._vptr_TestNode = (_func_int **)pCVar2;
          pTVar9->_vptr_TestNode = (_func_int **)&PTR__CopyImageTest_02171600;
          pTVar9[1].m_testCtx = local_50;
          pTVar9[1].m_name._M_dataplus._M_p = local_3c;
          *(undefined4 *)&pTVar9[1].m_name._M_string_length = local_34;
          *(ulong *)((long)&pTVar9[1].m_name._M_string_length + 4) =
               ((ulong)uVar1 << 0x20) + local_60;
          *(undefined8 *)((long)&pTVar9[1].m_name.field_2 + 4) = local_48;
          *(undefined4 *)((long)&pTVar9[1].m_name.field_2 + 0xc) = local_40;
          *(undefined4 *)&pTVar9[1].m_description._M_dataplus._M_p = 0;
          pTVar9[1].m_description._M_string_length = 0;
          tcu::TestNode::addChild(local_58,pTVar9);
          internalFormat = local_e4;
          if (local_108 != &local_f8) {
            operator_delete(local_108,local_f8 + 1);
          }
        }
        lVar15 = lVar15 + 1;
        puVar12 = puVar12 + 1;
      } while (lVar15 != 5);
    }
    lVar15 = local_a0 + 1;
  } while (lVar15 != 5);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  return;
}

Assistant:

void addCopyTests (TestCaseGroup* root, deUint32 srcFormat, deUint32 dstFormat)
{
	const string			groupName	= string(formatToName(srcFormat)) + "_" + formatToName(dstFormat);
	TestCaseGroup* const	group		= new TestCaseGroup(root->getContext(), groupName.c_str(), groupName.c_str());

	const deUint32 targets[] =
	{
		GL_TEXTURE_2D,
		GL_TEXTURE_3D,
		GL_TEXTURE_CUBE_MAP,
		GL_TEXTURE_2D_ARRAY,
		GL_RENDERBUFFER
	};

	root->addChild(group);

	for (int srcTargetNdx = 0; srcTargetNdx < DE_LENGTH_OF_ARRAY(targets); srcTargetNdx++)
	{
		const deUint32	srcTarget				= targets[srcTargetNdx];
		const bool		srcIs3D					= srcTarget == GL_TEXTURE_2D_ARRAY || srcTarget == GL_TEXTURE_3D;

		if (glu::isCompressedFormat(srcFormat) && srcTarget == GL_RENDERBUFFER)
			continue;

		if (srcTarget == GL_RENDERBUFFER && !isColorRenderable(srcFormat))
			continue;

		if (glu::isCompressedFormat(srcFormat) && !tcu::isAstcFormat(glu::mapGLCompressedTexFormat(srcFormat)) && srcIs3D)
			continue;

		for (int dstTargetNdx = 0; dstTargetNdx < DE_LENGTH_OF_ARRAY(targets); dstTargetNdx++)
		{
			const deUint32	dstTarget				= targets[dstTargetNdx];
			const bool		dstIs3D					= dstTarget == GL_TEXTURE_2D_ARRAY || dstTarget == GL_TEXTURE_3D;

			if (glu::isCompressedFormat(dstFormat) && dstTarget == GL_RENDERBUFFER)
				continue;

			if (dstTarget == GL_RENDERBUFFER && !isColorRenderable(dstFormat))
				continue;

			if (glu::isCompressedFormat(dstFormat) && !tcu::isAstcFormat(glu::mapGLCompressedTexFormat(dstFormat)) && dstIs3D)
				continue;

			const string	targetTestName	= string(targetToName(srcTarget)) + "_to_" + targetToName(dstTarget);

			// Compressed formats require more space to fit all block size combinations.
			const bool		isCompressedCase	= glu::isCompressedFormat(srcFormat) || glu::isCompressedFormat(dstFormat);
			const IVec3		targetSize			= isCompressedCase ? IVec3(128, 128, 16) : IVec3(64, 64, 8);
			const IVec3		srcSize				= getTestedSize(srcTarget, srcFormat, targetSize);
			const IVec3		dstSize				= getTestedSize(dstTarget, dstFormat, targetSize);

			group->addChild(new CopyImageTest(root->getContext(),
											ImageInfo(srcFormat, srcTarget, srcSize),
											ImageInfo(dstFormat, dstTarget, dstSize),
											targetTestName.c_str(), targetTestName.c_str()));
		}
	}
}